

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::p_formatter<spdlog::details::null_scoped_padder>::format
          (p_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_2,tm *tm_time,
          memory_buf_t *dest)

{
  string_view_t view;
  memory_buf_t *in_RCX;
  tm *in_RDX;
  long in_RDI;
  null_scoped_padder p;
  size_t field_size;
  memory_buf_t *in_stack_ffffffffffffffc0;
  char *pcVar1;
  
  pcVar1 = (char *)0x2;
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffc7,2,(padding_info *)(in_RDI + 8),in_RCX);
  ampm(in_RDX);
  std::char_traits<char>::length((char_type *)0x22ed42);
  view.size_ = (size_t)in_RCX;
  view.data_ = pcVar1;
  fmt_helper::append_string_view(view,in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 2;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }